

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::Utils::texture::create
          (texture *this,GLuint width,GLuint height,GLuint depth,GLenum internal_format,
          TEXTURE_TYPES texture_type)

{
  TEXTURE_TYPES TVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  socklen_t __len;
  sockaddr *__addr;
  char *msg;
  long lVar5;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  release(this);
  this->m_texture_type = texture_type;
  GVar3 = getTextureTartet(texture_type);
  (**(code **)(lVar5 + 0x6f8))(1,this);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  iVar2 = 0x1ba8645;
  __len = 0x4844;
  glu::checkError(dVar4,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4844);
  bind(this,iVar2,__addr,__len);
  TVar1 = this->m_texture_type;
  if (TVar1 < TEXTURE_TYPES_MAX) {
    if ((0xa6U >> (TVar1 & 0x1f) & 1) == 0) {
      if ((0x18U >> (TVar1 & 0x1f) & 1) == 0) {
        if (TVar1 != TEX_1D) goto LAB_009dcfe7;
        (**(code **)(lVar5 + 0x1370))(GVar3,1,internal_format,width);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        msg = "TexStorage1D";
        iVar2 = 0x484c;
      }
      else {
        (**(code **)(lVar5 + 0x1398))(GVar3,1,internal_format,width,height,depth);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        msg = "TexStorage3D";
        iVar2 = 0x4858;
      }
    }
    else {
      (**(code **)(lVar5 + 0x1380))(GVar3,1,internal_format,width,height);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      msg = "TexStorage2D";
      iVar2 = 0x4853;
    }
    glu::checkError(dVar4,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,iVar2);
    return;
  }
LAB_009dcfe7:
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invliad enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x485b);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Utils::texture::create(GLuint width, GLuint height, GLuint depth, GLenum internal_format,
							TEXTURE_TYPES texture_type)
{
	static const GLuint levels = 1;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	release();

	m_texture_type = texture_type;

	GLenum target = getTextureTartet(m_texture_type);

	gl.genTextures(1, &m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	bind();

	switch (m_texture_type)
	{
	case TEX_1D:
		gl.texStorage1D(target, levels, internal_format, width);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage1D");
		break;
	case TEX_2D:
	case TEX_1D_ARRAY:
	case TEX_2D_RECT:
	case TEX_CUBE:
		gl.texStorage2D(target, levels, internal_format, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
		break;
	case TEX_3D:
	case TEX_2D_ARRAY:
		gl.texStorage3D(target, levels, internal_format, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage3D");
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}